

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_hash_set.cc
# Opt level: O0

void absl::lts_20250127::container_internal::EraseMetaOnly
               (CommonFields *c,size_t index,size_t slot_size)

{
  bool bVar1;
  ctrl_t *pcVar2;
  GrowthInfo *pGVar3;
  HashtablezInfoHandle local_21;
  size_t local_20;
  size_t slot_size_local;
  size_t index_local;
  CommonFields *c_local;
  
  local_20 = slot_size;
  slot_size_local = index;
  index_local = (size_t)c;
  pcVar2 = CommonFields::control(c);
  bVar1 = IsFull(pcVar2[slot_size_local]);
  if (!bVar1) {
    __assert_fail("IsFull(c.control()[index]) && \"erasing a dangling iterator\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O0/_deps/absl-src/absl/container/internal/raw_hash_set.cc"
                  ,0x145,
                  "void absl::container_internal::EraseMetaOnly(CommonFields &, size_t, size_t)");
  }
  CommonFields::decrement_size((CommonFields *)index_local);
  CommonFields::infoz((CommonFields *)index_local);
  HashtablezInfoHandle::RecordErase(&local_21);
  bVar1 = anon_unknown_2::WasNeverFull((CommonFields *)index_local,slot_size_local);
  if (bVar1) {
    SetCtrl((CommonFields *)index_local,slot_size_local,kEmpty,local_20);
    pGVar3 = CommonFields::growth_info((CommonFields *)index_local);
    GrowthInfo::OverwriteFullAsEmpty(pGVar3);
  }
  else {
    pGVar3 = CommonFields::growth_info((CommonFields *)index_local);
    GrowthInfo::OverwriteFullAsDeleted(pGVar3);
    SetCtrl((CommonFields *)index_local,slot_size_local,kDeleted,local_20);
  }
  return;
}

Assistant:

void EraseMetaOnly(CommonFields& c, size_t index, size_t slot_size) {
  assert(IsFull(c.control()[index]) && "erasing a dangling iterator");
  c.decrement_size();
  c.infoz().RecordErase();

  if (WasNeverFull(c, index)) {
    SetCtrl(c, index, ctrl_t::kEmpty, slot_size);
    c.growth_info().OverwriteFullAsEmpty();
    return;
  }

  c.growth_info().OverwriteFullAsDeleted();
  SetCtrl(c, index, ctrl_t::kDeleted, slot_size);
}